

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<float> *original_costs,double cost_constant
            )

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int *piVar10;
  float theta_00;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float local_188;
  uint local_178;
  int iter;
  int remaining_1;
  int push;
  int remaining;
  long i;
  int best_remaining;
  float kappa;
  float kappa_start;
  bool is_a_solution;
  compute_order compute;
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  slv;
  long w_limit;
  float pushing_objective_amplifier;
  float pushing_k_factor;
  float delta;
  float theta;
  float alpha;
  float kappa_max;
  float kappa_step;
  undefined1 local_68 [8];
  default_cost_type<float> norm_costs;
  solver_parameters *p;
  bit_array x;
  double cost_constant_local;
  default_cost_type<float> *original_costs_local;
  int variables_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
  *best_recorder_local;
  atomic_bool *stop_task_local;
  optimize_functor<baryonyx::itm::solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>,_float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
  *this_local;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       cost_constant;
  bit_array::bit_array((bit_array *)&p,variables);
  norm_costs.linear_elements._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)this->m_ctx;
  normalize_costs<float,baryonyx::itm::default_cost_type<float>>
            ((itm *)local_68,this->m_ctx,original_costs,&(this->m_local_ctx).rng,variables);
  dVar1 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x20);
  dVar2 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x28);
  dVar3 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x30);
  theta_00 = (float)*(double *)
                     ((long)norm_costs.linear_elements._M_t.
                            super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                            super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                            super__Head_base<0UL,_float_*,_false>._M_head_impl + 8);
  if (0.0 <= *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10)) {
    local_188 = (float)*(double *)
                        ((long)norm_costs.linear_elements._M_t.
                               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                               super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x10);
  }
  else {
    local_188 = compute_delta<float,baryonyx::itm::default_cost_type<float>>
                          (this->m_ctx,(default_cost_type<float> *)local_68,theta_00,variables);
  }
  dVar4 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x38);
  dVar5 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x40);
  dVar6 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                  super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa0);
  iVar9 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (constraints);
  solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  ::solver_inequalities_01coeff
            ((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
              *)&compute.order,&(this->m_local_ctx).rng,iVar9,variables,(cost_type *)local_68,
             constraints);
  compute_order::compute_order
            ((compute_order *)&kappa_start,
             *(constraint_order *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xcc),variables);
  kappa._3_1_ = 0;
  do {
    bVar7 = std::atomic<bool>::load(stop_task,seq_cst);
    if (((bVar7 ^ 0xffU) & 1) == 0) {
      compute_order::~compute_order((compute_order *)&kappa_start);
      solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
      ::~solver_inequalities_01coeff
                ((solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                  *)&compute.order);
      default_cost_type<float>::~default_cost_type((default_cost_type<float> *)local_68);
      bit_array::~bit_array((bit_array *)&p);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    dVar11 = best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
             ::reinit(best_recorder,&this->m_local_ctx,(bool)(kappa._3_1_ & 1),
                      *(double *)
                       ((long)norm_costs.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x18),
                      *(double *)
                       ((long)norm_costs.linear_elements._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl + 0x28),
                      (bit_array *)&p);
    i._4_4_ = (float)dVar11;
    best_remaining = (int)i._4_4_;
    compute_order::
    init<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array>
              ((compute_order *)&kappa_start,
               (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                *)&compute.order,(bit_array *)&p);
    i._0_4_ = 0x7fffffff;
    kappa._3_1_ = 0;
    _push = 0;
    while( true ) {
      bVar8 = std::atomic<bool>::load(stop_task,seq_cst);
      bVar7 = false;
      if (!bVar8) {
        bVar7 = _push != *(long *)((long)norm_costs.linear_elements._M_t.
                                         super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                         .super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb0)
        ;
      }
      if (!bVar7) goto LAB_006aa7b9;
      remaining_1 = compute_order::
                    run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>
                              ((compute_order *)&kappa_start,
                               (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                                *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,i._4_4_,
                               local_188,theta_00);
      if (remaining_1 == 0) break;
      piVar10 = std::min<int>(&remaining_1,(int *)&i);
      i._0_4_ = *piVar10;
      if ((long)dVar6 < _push) {
        auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar12._0_4_ = (float)remaining_1 / (float)(int)slv.c;
        auVar14._0_8_ = std::pow(auVar12._0_8_,(double)(ulong)(uint)(float)dVar3);
        auVar14._8_56_ = extraout_var;
        auVar12 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)(float)dVar1),ZEXT416((uint)i._4_4_))
        ;
        i._4_4_ = auVar12._0_4_;
      }
      if ((float)dVar2 < i._4_4_) goto LAB_006aa7b9;
      _push = _push + 1;
    }
    dVar11 = default_cost_type<float>::results
                       (original_costs,(bit_array *)&p,
                        (double)x.super_bit_array_impl.m_data._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
    ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar11,_push);
    i._0_4_ = 0;
    kappa._3_1_ = 1;
LAB_006aa7b9:
    if ((int)i < 1) {
      iter = 0;
      while( true ) {
        bVar8 = std::atomic<bool>::load(stop_task,seq_cst);
        bVar7 = false;
        if (!bVar8) {
          bVar7 = iter < *(int *)((long)norm_costs.linear_elements._M_t.
                                        super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                        .super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xbc);
        }
        if (!bVar7) break;
        iVar9 = compute_order::
                push_and_run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>
                          ((compute_order *)&kappa_start,
                           (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                            *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,(float)dVar4,
                           local_188,theta_00,(float)dVar5);
        if (iVar9 == 0) {
          dVar11 = default_cost_type<float>::results
                             (original_costs,(bit_array *)&p,
                              (double)x.super_bit_array_impl.m_data._M_t.
                                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
          best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
          ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar11,
                       (long)(-iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc0) + -1));
          kappa._3_1_ = 1;
        }
        i._4_4_ = (float)best_remaining;
        local_178 = 0;
        while( true ) {
          bVar8 = std::atomic<bool>::load(stop_task,seq_cst);
          bVar7 = false;
          if (!bVar8) {
            bVar7 = (int)local_178 <
                    *(int *)((long)norm_costs.linear_elements._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xc0);
          }
          if (!bVar7) goto LAB_006aaac6;
          iVar9 = compute_order::
                  run<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,float>
                            ((compute_order *)&kappa_start,
                             (solver_inequalities_01coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                              *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,i._4_4_,
                             local_188,theta_00);
          if (iVar9 == 0) break;
          if (*(double *)
               ((long)norm_costs.linear_elements._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xa0) <
              (double)(int)local_178) {
            auVar13._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar13._0_4_ = (float)iVar9 / (float)(int)slv.c;
            auVar15._0_8_ = std::pow(auVar13._0_8_,(double)(ulong)(uint)(float)dVar3);
            auVar15._8_56_ = extraout_var_00;
            auVar12 = vfmadd213ss_fma(auVar15._0_16_,ZEXT416((uint)(float)dVar1),
                                      ZEXT416((uint)i._4_4_));
            i._4_4_ = auVar12._0_4_;
          }
          if ((float)dVar2 < i._4_4_) goto LAB_006aaac6;
          local_178 = local_178 + 1;
        }
        dVar11 = default_cost_type<float>::results
                           (original_costs,(bit_array *)&p,
                            (double)x.super_bit_array_impl.m_data._M_t.
                                    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                    .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
        best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar11,
                     (long)(int)(~local_178 +
                                -iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl + 0xc0)));
        kappa._3_1_ = 1;
LAB_006aaac6:
        iter = iter + 1;
      }
    }
    else {
      best_solution_recorder<baryonyx::itm::default_cost_type<float>,_float,_baryonyx::itm::minimize_tag>
      ::try_advance(best_recorder,&this->m_local_ctx,(bit_array *)&p,(int)i,
                    *(long *)((long)norm_costs.linear_elements._M_t.
                                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                                    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                    super__Head_base<0UL,_float_*,_false>._M_head_impl + 0xb0));
    }
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }